

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O1

ARKodeSPRKTable ARKodeSPRKTable_LoadByName(char *method)

{
  int iVar1;
  ARKodeSPRKTable pAVar2;
  
  iVar1 = strcmp(method,"ARKODE_SPRK_EULER_1_1");
  if (iVar1 == 0) {
    pAVar2 = ARKodeSPRKTable_Alloc(1);
    if (pAVar2 != (ARKodeSPRKTable)0x0) {
      pAVar2->q = 1;
      pAVar2->stages = 1;
      *pAVar2->a = 1.0;
      *pAVar2->ahat = 1.0;
      return pAVar2;
    }
  }
  else {
    iVar1 = strcmp(method,"ARKODE_SPRK_LEAPFROG_2_2");
    if (iVar1 == 0) {
      pAVar2 = arkodeSymplecticLeapfrog2();
      return pAVar2;
    }
    iVar1 = strcmp(method,"ARKODE_SPRK_PSEUDO_LEAPFROG_2_2");
    if (iVar1 == 0) {
      pAVar2 = arkodeSymplecticPseudoLeapfrog2();
      return pAVar2;
    }
    iVar1 = strcmp(method,"ARKODE_SPRK_RUTH_3_3");
    if (iVar1 == 0) {
      pAVar2 = arkodeSymplecticRuth3();
      return pAVar2;
    }
    iVar1 = strcmp(method,"ARKODE_SPRK_MCLACHLAN_2_2");
    if (iVar1 == 0) {
      pAVar2 = arkodeSymplecticMcLachlan2();
      return pAVar2;
    }
    iVar1 = strcmp(method,"ARKODE_SPRK_MCLACHLAN_3_3");
    if (iVar1 == 0) {
      pAVar2 = arkodeSymplecticMcLachlan3();
      return pAVar2;
    }
    iVar1 = strcmp(method,"ARKODE_SPRK_MCLACHLAN_4_4");
    if (iVar1 == 0) {
      pAVar2 = arkodeSymplecticMcLachlan4();
      return pAVar2;
    }
    iVar1 = strcmp(method,"ARKODE_SPRK_CANDY_ROZMUS_4_4");
    if (iVar1 == 0) {
      pAVar2 = arkodeSymplecticCandyRozmus4();
      return pAVar2;
    }
    iVar1 = strcmp(method,"ARKODE_SPRK_MCLACHLAN_5_6");
    if (iVar1 == 0) {
      pAVar2 = arkodeSymplecticMcLachlan5();
      return pAVar2;
    }
    iVar1 = strcmp(method,"ARKODE_SPRK_YOSHIDA_6_8");
    if (iVar1 == 0) {
      pAVar2 = arkodeSymplecticYoshida6();
      return pAVar2;
    }
    iVar1 = strcmp(method,"ARKODE_SPRK_SUZUKI_UMENO_8_16");
    if (iVar1 == 0) {
      pAVar2 = arkodeSymplecticSuzukiUmeno816();
      return pAVar2;
    }
    iVar1 = strcmp(method,"ARKODE_SPRK_SOFRONIOU_10_36");
    if (iVar1 == 0) {
      pAVar2 = arkodeSymplecticSofroniou10();
      return pAVar2;
    }
  }
  return (ARKodeSPRKTable)0x0;
}

Assistant:

ARKodeSPRKTable ARKodeSPRKTable_LoadByName(const char* method)
{
  if (!strcmp(method, "ARKODE_SPRK_EULER_1_1"))
  {
    return arkodeSymplecticEuler();
  }
  if (!strcmp(method, "ARKODE_SPRK_LEAPFROG_2_2"))
  {
    return arkodeSymplecticLeapfrog2();
  }
  if (!strcmp(method, "ARKODE_SPRK_PSEUDO_LEAPFROG_2_2"))
  {
    return arkodeSymplecticPseudoLeapfrog2();
  }
  if (!strcmp(method, "ARKODE_SPRK_RUTH_3_3"))
  {
    return arkodeSymplecticRuth3();
  }
  if (!strcmp(method, "ARKODE_SPRK_MCLACHLAN_2_2"))
  {
    return arkodeSymplecticMcLachlan2();
  }
  if (!strcmp(method, "ARKODE_SPRK_MCLACHLAN_3_3"))
  {
    return arkodeSymplecticMcLachlan3();
  }
  if (!strcmp(method, "ARKODE_SPRK_MCLACHLAN_4_4"))
  {
    return arkodeSymplecticMcLachlan4();
  }
  if (!strcmp(method, "ARKODE_SPRK_CANDY_ROZMUS_4_4"))
  {
    return arkodeSymplecticCandyRozmus4();
  }
  if (!strcmp(method, "ARKODE_SPRK_MCLACHLAN_5_6"))
  {
    return arkodeSymplecticMcLachlan5();
  }
  if (!strcmp(method, "ARKODE_SPRK_YOSHIDA_6_8"))
  {
    return arkodeSymplecticYoshida6();
  }
  if (!strcmp(method, "ARKODE_SPRK_SUZUKI_UMENO_8_16"))
  {
    return arkodeSymplecticSuzukiUmeno816();
  }
  if (!strcmp(method, "ARKODE_SPRK_SOFRONIOU_10_36"))
  {
    return arkodeSymplecticSofroniou10();
  }
  return NULL;
}